

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_stop_times_db(feed_db_t *db,stop_time_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_1c8 [8];
  char qr [160];
  sqlite3_stmt *stmt;
  int i;
  int record_count;
  feed_db_status_t res;
  stop_time_t record;
  stop_time_t **records_local;
  feed_db_t *db_local;
  
  record._232_8_ = records;
  db_local._4_4_ = count_rows_db(db,"stop_times");
  stmt._4_4_ = 0;
  if (0 < db_local._4_4_) {
    memcpy(local_1c8,
           "SELECT trip_id, arrival_time, departure_time,stop_id, stop_sequence, stop_headsign,pickup_type, drop_off_type,shape_dist_traveled, timepoint FROM `stop_times`;"
           ,0xa0);
    sqlite3_prepare_v2(db->conn,local_1c8,-1,(sqlite3_stmt **)(qr + 0x98),(char **)0x0);
    pvVar2 = malloc((long)db_local._4_4_ * 0xf0);
    *(void **)record._232_8_ = pvVar2;
    if (*(long *)record._232_8_ == 0) {
      sqlite3_finalize((sqlite3_stmt *)qr._152_8_);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step((sqlite3_stmt *)qr._152_8_);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_stop_time((stop_time_t *)&record_count);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._152_8_,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._152_8_,1);
        strcpy(record.trip_id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._152_8_,2);
        strcpy(record.arrival_time + 1,(char *)puVar3);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._152_8_,3);
        strcpy(record.departure_time + 1,(char *)puVar3);
        record.stop_id._58_4_ = sqlite3_column_int((sqlite3_stmt *)qr._152_8_,4);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._152_8_,5);
        strcpy(record.stop_id + 0x3e,(char *)puVar3);
        record.stop_headsign._56_4_ = sqlite3_column_int((sqlite3_stmt *)qr._152_8_,6);
        record.stop_headsign._60_4_ = sqlite3_column_int((sqlite3_stmt *)qr._152_8_,7);
        record._216_8_ = sqlite3_column_double((sqlite3_stmt *)qr._152_8_,8);
        record.shape_dist_traveled._0_4_ = sqlite3_column_int((sqlite3_stmt *)qr._152_8_,9);
        memcpy((void *)(*(long *)record._232_8_ + (long)stmt._4_4_ * 0xf0),&record_count,0xf0);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < db_local._4_4_);
      sqlite3_finalize((sqlite3_stmt *)qr._152_8_);
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_stop_times_db(feed_db_t *db, stop_time_t **records) {

    stop_time_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "stop_times");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "trip_id, arrival_time, departure_time,"
                    "stop_id, stop_sequence, stop_headsign,"
                    "pickup_type, drop_off_type,"
                    "shape_dist_traveled, timepoint "
                "FROM `stop_times`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_stop_time(&record);

        strcpy(record.trip_id, sqlite3_column_text(stmt, 0));
        strcpy(record.arrival_time, sqlite3_column_text(stmt, 1));
        strcpy(record.departure_time, sqlite3_column_text(stmt, 2));
        strcpy(record.stop_id, sqlite3_column_text(stmt, 3));
        record.stop_sequence = sqlite3_column_int(stmt, 4);
        strcpy(record.stop_headsign, sqlite3_column_text(stmt, 5));
        record.pickup_type = (stop_type_t)sqlite3_column_int(stmt, 6);
        record.dropoff_type = (stop_type_t)sqlite3_column_int(stmt, 7);
        record.shape_dist_traveled = sqlite3_column_double(stmt, 8);
        record.timepoint = (timepoint_precision_t)sqlite3_column_int(stmt, 9);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}